

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

void mtele_trap(monst *mtmp,trap *trap,int in_sight)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  mkroom *croom;
  char *line;
  coord c;
  coord local_2a;
  
  bVar2 = tele_restrict(mtmp);
  if (bVar2 != '\0') {
    return;
  }
  bVar2 = teleport_pet(mtmp,'\0');
  if (bVar2 == '\0') {
    return;
  }
  pcVar3 = Monnam(mtmp);
  if (((((trap->field_0x8 & 0x40) == 0) ||
       (croom = search_special(level,'\x04'), croom == (mkroom *)0x0)) ||
      (bVar2 = somexy(level,croom,&local_2a), bVar2 == '\0')) ||
     (bVar2 = goodpos(level,(int)local_2a.x,(int)local_2a.y,mtmp,0), bVar2 == '\0')) {
    rloc(level,mtmp,'\0');
  }
  else {
    rloc_to(mtmp,level,(int)local_2a.x,(int)local_2a.y);
  }
  if (in_sight == 0) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
         (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))))
    goto LAB_0025aaef;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') {
LAB_0025aaef:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar1 & 0x280) == 0) {
LAB_0025ab38:
          if ((u._1052_1_ & 0x20) == 0) {
            line = "%s seems disoriented.";
            goto LAB_0025ab51;
          }
        }
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0025ab38;
    }
  }
  line = "%s suddenly disappears!";
LAB_0025ab51:
  pline(line,pcVar3);
  seetrap(trap);
  return;
}

Assistant:

void mtele_trap(struct monst *mtmp, struct trap *trap, int in_sight)
{
	char *monname;

	if (tele_restrict(mtmp)) return;
	if (teleport_pet(mtmp, FALSE)) {
	    /* save name with pre-movement visibility */
	    monname = Monnam(mtmp);

	    /* Note: don't remove the trap if a vault.  Other-
	     * wise the monster will be stuck there, since
	     * the guard isn't going to come for it...
	     */
	    if (trap->once) mvault_tele(mtmp);
	    else rloc(level, mtmp, FALSE);

	    if (in_sight) {
		if (canseemon(level, mtmp))
		    pline("%s seems disoriented.", monname);
		else
		    pline("%s suddenly disappears!", monname);
		seetrap(trap);
	    }
	}
}